

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O1

uint __thiscall BigNumber::numOfTrimCharsOnLeft(BigNumber *this,string *str)

{
  char cVar1;
  pointer pcVar2;
  ulong uVar3;
  
  pcVar2 = (str->_M_dataplus)._M_p;
  for (uVar3 = 0;
      (((uVar3 < str->_M_string_length - 1 && (pcVar2[uVar3] == '0')) ||
       (cVar1 = pcVar2[uVar3], cVar1 == '-')) || (cVar1 == '+')); uVar3 = uVar3 + 1) {
  }
  return (uint)uVar3;
}

Assistant:

unsigned BigNumber::numOfTrimCharsOnLeft(const std::string &str) {
    unsigned numOfChars = 0;
    size_t i = 0;
    while( i < str.size() - 1 && str[i] == '0' || str[i] == '-' || str[i] == '+'){
        ++numOfChars;
        ++i;
    }
    return numOfChars;
}